

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.cpp
# Opt level: O1

void modify_function<std::function<cs_impl::any(std::vector<cs_impl::any,std::allocator<cs_impl::any>>&)>const&,cs::callable::types>
               (var *func,
               function<cs_impl::any_(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>
               *args,types *args_1)

{
  short sVar1;
  any local_20;
  
  sVar1 = func->mDat->protect_level;
  func->mDat->protect_level = 0;
  cs_impl::any::
  make<cs::callable,std::function<cs_impl::any(std::vector<cs_impl::any,std::allocator<cs_impl::any>>&)>const&,cs::callable::types>
            (&local_20,args,args_1);
  cs_impl::any::swap(func,&local_20,true);
  cs_impl::any::recycle(&local_20);
  func->mDat->protect_level = sVar1;
  return;
}

Assistant:

void modify_function(cs::var &func, ArgsT &&...args) {
    int level = remove_protect(func);
    func.swap(cs::var::make<cs::callable>(std::forward<ArgsT>(args)...), true);
    set_protect(func, level);
}